

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcCollapse.c
# Opt level: O1

Abc_Ntk_t *
Abc_NtkFromSopsInt(Abc_Ntk_t *pNtk,int nCubeLim,int nBTLimit,int nCostMax,int fCanon,int fReverse,
                  int fCnfShared,int fVerbose)

{
  void *pvVar1;
  Abc_Obj_t *pObj;
  Vec_Int_t *pVVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  Gia_Man_t *p;
  Vec_Wec_t *vSupps;
  Abc_Ntk_t *pNtkNew;
  Vec_Ptr_t *__ptr;
  Vec_Ptr_t *pVVar6;
  char *pcVar7;
  char *pcVar8;
  Abc_Obj_t *pObj_00;
  Abc_Obj_t *pAVar9;
  ulong uVar10;
  Mem_Flex_t *pMan;
  Abc_Obj_t *pAVar11;
  undefined4 in_register_0000008c;
  long lVar12;
  ulong uVar13;
  long lVar14;
  int iObjMax;
  ulong local_40;
  undefined8 local_38;
  
  local_38 = CONCAT44(in_register_0000008c,fReverse);
  uVar13 = (ulong)(uint)fCanon;
  p = Abc_NtkClpGia(pNtk);
  vSupps = Gia_ManCreateCoSupps(p,fVerbose);
  if (0 < nCostMax && 0 < nCubeLim) {
    uVar3 = Gia_ManCoLargestSupp(p,vSupps);
    if (((int)uVar3 < 0) || (p->vCos->nSize <= (int)uVar3)) {
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                    ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
    }
    iObjMax = p->vCos->pArray[uVar3];
    if ((iObjMax < 0) || (p->nObjs <= iObjMax)) {
      __assert_fail("v >= 0 && v < p->nObjs",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                    ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
    }
    local_40 = uVar13;
    if (vSupps->nSize <= (int)uVar3) {
LAB_002a2fa9:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecWec.h"
                    ,0x9c,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
    }
    uVar3 = vSupps->pArray[uVar3].nSize;
    uVar4 = Gia_ManConeSize(p,&iObjMax,1);
    uVar10 = (ulong)(uint)nCubeLim * (long)(int)uVar4 * (long)(int)uVar3;
    uVar13 = local_40;
    if ((uint)nCostMax <= uVar10 && uVar10 - (uint)nCostMax != 0) {
      printf("Cost of the largest output cone exceeded the limit (%d * %d * %d  >  %d).\n",
             (ulong)uVar4,(ulong)uVar3,nCubeLim,(ulong)(uint)nCostMax);
      Gia_ManStop(p);
      if (0 < vSupps->nCap) {
        lVar12 = 8;
        lVar14 = 0;
        do {
          pvVar1 = *(void **)((long)&vSupps->pArray->nCap + lVar12);
          if (pvVar1 != (void *)0x0) {
            free(pvVar1);
            *(undefined8 *)((long)&vSupps->pArray->nCap + lVar12) = 0;
          }
          lVar14 = lVar14 + 1;
          lVar12 = lVar12 + 0x10;
        } while (lVar14 < vSupps->nCap);
      }
      if (vSupps->pArray != (Vec_Int_t *)0x0) {
        free(vSupps->pArray);
        vSupps->pArray = (Vec_Int_t *)0x0;
      }
      vSupps->nCap = 0;
      vSupps->nSize = 0;
      free(vSupps);
      return (Abc_Ntk_t *)0x0;
    }
  }
  pNtkNew = Abc_NtkStartFrom(pNtk,ABC_NTK_LOGIC,ABC_FUNC_SOP);
  __ptr = Abc_GiaDeriveSops(pNtkNew,p,vSupps,nCubeLim,nBTLimit,(int)uVar13,(int)uVar13,(int)local_38
                            ,fCnfShared,fVerbose);
  Gia_ManStop(p);
  if (__ptr == (Vec_Ptr_t *)0x0) {
    if (0 < vSupps->nCap) {
      lVar12 = 8;
      lVar14 = 0;
      do {
        pvVar1 = *(void **)((long)&vSupps->pArray->nCap + lVar12);
        if (pvVar1 != (void *)0x0) {
          free(pvVar1);
          *(undefined8 *)((long)&vSupps->pArray->nCap + lVar12) = 0;
        }
        lVar14 = lVar14 + 1;
        lVar12 = lVar12 + 0x10;
      } while (lVar14 < vSupps->nCap);
    }
    if (vSupps->pArray != (Vec_Int_t *)0x0) {
      free(vSupps->pArray);
      vSupps->pArray = (Vec_Int_t *)0x0;
    }
    vSupps->nCap = 0;
    vSupps->nSize = 0;
    free(vSupps);
    Abc_NtkDelete(pNtkNew);
    return (Abc_Ntk_t *)0x0;
  }
  pVVar6 = pNtk->vCos;
  if (0 < pVVar6->nSize) {
    lVar12 = 0;
    do {
      pAVar11 = (Abc_Obj_t *)pVVar6->pArray[lVar12];
      pObj = (Abc_Obj_t *)pAVar11->pNtk->vObjs->pArray[*(pAVar11->vFanins).pArray];
      uVar3 = *(uint *)&pObj->field_0x14 & 0xf;
      if ((uVar3 == 5) || (uVar3 == 2)) {
        pcVar7 = Abc_ObjName(pAVar11);
        pcVar8 = Abc_ObjName(pObj);
        iVar5 = strcmp(pcVar7,pcVar8);
        if (iVar5 != 0) goto LAB_002a2cfb;
        pAVar11 = (pAVar11->field_6).pCopy;
        pObj_00 = (pObj->field_6).pCopy;
      }
      else {
LAB_002a2cfb:
        uVar3 = *(uint *)&pObj->field_0x14 & 0xf;
        if ((uVar3 == 5) || (uVar3 == 2)) {
          pObj_00 = Abc_NtkCreateObj(pNtkNew,ABC_OBJ_NODE);
          Abc_ObjAddFanin(pObj_00,(pObj->field_6).pCopy);
          uVar3 = *(uint *)&pAVar11->field_0x14;
          pMan = (Mem_Flex_t *)pNtkNew->pManFunc;
          pcVar7 = "0 1\n";
          pcVar8 = "1 1\n";
LAB_002a2d45:
          if ((uVar3 >> 10 & 1) == 0) {
            pcVar7 = pcVar8;
          }
          pcVar7 = Abc_SopRegister(pMan,pcVar7);
          (pObj_00->field_5).pData = pcVar7;
        }
        else {
          pAVar9 = Abc_AigConst1(pNtk);
          pObj_00 = Abc_NtkCreateObj(pNtkNew,ABC_OBJ_NODE);
          if (pObj == pAVar9) {
            uVar3 = *(uint *)&pAVar11->field_0x14;
            pMan = (Mem_Flex_t *)pNtkNew->pManFunc;
            pcVar7 = " 0\n";
            pcVar8 = " 1\n";
            goto LAB_002a2d45;
          }
          if (vSupps->nSize <= lVar12) goto LAB_002a2fa9;
          pVVar2 = vSupps->pArray;
          if (0 < pVVar2[lVar12].nSize) {
            lVar14 = 0;
            do {
              iVar5 = pVVar2[lVar12].pArray[lVar14];
              if (((long)iVar5 < 0) || (pNtkNew->vCis->nSize <= iVar5)) goto LAB_002a2f8a;
              Abc_ObjAddFanin(pObj_00,(Abc_Obj_t *)pNtkNew->vCis->pArray[iVar5]);
              lVar14 = lVar14 + 1;
            } while (lVar14 < pVVar2[lVar12].nSize);
          }
          if (__ptr->nSize <= lVar12) {
LAB_002a2f8a:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                          ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
          }
          pcVar7 = Abc_SopRegister((Mem_Flex_t *)pNtkNew->pManFunc,(char *)__ptr->pArray[lVar12]);
          (pObj_00->field_5).pData = pcVar7;
          if (pcVar7 == (char *)0x1) {
            __assert_fail("pNodeNew->pData != (void *)(ABC_PTRINT_T)1",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcCollapse.c"
                          ,0x3a7,
                          "Abc_Ntk_t *Abc_NtkFromSopsInt(Abc_Ntk_t *, int, int, int, int, int, int, int)"
                         );
          }
        }
        pAVar11 = (pAVar11->field_6).pCopy;
      }
      Abc_ObjAddFanin(pAVar11,pObj_00);
      lVar12 = lVar12 + 1;
      pVVar6 = pNtk->vCos;
    } while (lVar12 < pVVar6->nSize);
  }
  if (0 < vSupps->nCap) {
    lVar12 = 8;
    lVar14 = 0;
    do {
      pvVar1 = *(void **)((long)&vSupps->pArray->nCap + lVar12);
      if (pvVar1 != (void *)0x0) {
        free(pvVar1);
        *(undefined8 *)((long)&vSupps->pArray->nCap + lVar12) = 0;
      }
      lVar14 = lVar14 + 1;
      lVar12 = lVar12 + 0x10;
    } while (lVar14 < vSupps->nCap);
  }
  if (vSupps->pArray != (Vec_Int_t *)0x0) {
    free(vSupps->pArray);
    vSupps->pArray = (Vec_Int_t *)0x0;
  }
  vSupps->nCap = 0;
  vSupps->nSize = 0;
  free(vSupps);
  if (__ptr->pArray != (void **)0x0) {
    free(__ptr->pArray);
    __ptr->pArray = (void **)0x0;
  }
  free(__ptr);
  Abc_NtkSortSops(pNtkNew);
  return pNtkNew;
}

Assistant:

Abc_Ntk_t * Abc_NtkFromSopsInt( Abc_Ntk_t * pNtk, int nCubeLim, int nBTLimit, int nCostMax, int fCanon, int fReverse, int fCnfShared, int fVerbose )
{
    Abc_Ntk_t * pNtkNew;
    Gia_Man_t * pGia;
    Vec_Wec_t * vSupps;
    Vec_Int_t * vSupp;
    Vec_Ptr_t * vSops;
    Abc_Obj_t * pNode, * pNodeNew, * pDriver;
    int i, k, iCi; 
    pGia    = Abc_NtkClpGia( pNtk );
    vSupps  = Gia_ManCreateCoSupps( pGia, fVerbose );
    // check the largest output
    if ( nCubeLim > 0 && nCostMax > 0 )
    {
        int iCoMax   = Gia_ManCoLargestSupp( pGia, vSupps );
        int iObjMax  = Gia_ObjId( pGia, Gia_ManCo(pGia, iCoMax) );
        int nSuppMax = Vec_IntSize( Vec_WecEntry(vSupps, iCoMax) );
        int nNodeMax = Gia_ManConeSize( pGia, &iObjMax, 1 );
        word Cost = (word)nNodeMax * (word)nSuppMax * (word)nCubeLim;
        if ( Cost > (word)nCostMax )
        {
            printf( "Cost of the largest output cone exceeded the limit (%d * %d * %d  >  %d).\n", 
                nNodeMax, nSuppMax, nCubeLim, nCostMax );
            Gia_ManStop( pGia );
            Vec_WecFree( vSupps );
            return NULL;
        }
    }
    pNtkNew = Abc_NtkStartFrom( pNtk, ABC_NTK_LOGIC, ABC_FUNC_SOP );
    vSops   = Abc_GiaDeriveSops( pNtkNew, pGia, vSupps, nCubeLim, nBTLimit, nCostMax, fCanon, fReverse, fCnfShared, fVerbose );
    Gia_ManStop( pGia );
    if ( vSops == NULL )
    {
        Vec_WecFree( vSupps );
        Abc_NtkDelete( pNtkNew );
        return NULL;
    }
    Abc_NtkForEachCo( pNtk, pNode, i )
    {
        pDriver = Abc_ObjFanin0(pNode);
        if ( Abc_ObjIsCi(pDriver) && !strcmp(Abc_ObjName(pNode), Abc_ObjName(pDriver)) )
        {
            Abc_ObjAddFanin( pNode->pCopy, pDriver->pCopy );
            continue;
        }
        if ( Abc_ObjIsCi(pDriver) )
        {
            pNodeNew = Abc_NtkCreateNode( pNtkNew );
            Abc_ObjAddFanin( pNodeNew, pDriver->pCopy ); 
            pNodeNew->pData = Abc_SopRegister( (Mem_Flex_t *)pNtkNew->pManFunc, Abc_ObjFaninC0(pNode) ? "0 1\n" : "1 1\n" );
            Abc_ObjAddFanin( pNode->pCopy, pNodeNew );
            continue;
        }
        if ( pDriver == Abc_AigConst1(pNtk) )
        {
            pNodeNew = Abc_NtkCreateNode( pNtkNew );
            pNodeNew->pData = Abc_SopRegister( (Mem_Flex_t *)pNtkNew->pManFunc, Abc_ObjFaninC0(pNode) ? " 0\n" : " 1\n" );
            Abc_ObjAddFanin( pNode->pCopy, pNodeNew );
            continue;
        }
        pNodeNew = Abc_NtkCreateNode( pNtkNew );
        vSupp = Vec_WecEntry( vSupps, i );
        Vec_IntForEachEntry( vSupp, iCi, k )
            Abc_ObjAddFanin( pNodeNew, Abc_NtkCi(pNtkNew, iCi) );
        pNodeNew->pData = Abc_SopRegister( (Mem_Flex_t *)pNtkNew->pManFunc, (const char*)Vec_PtrEntry( vSops, i ) );
        assert( pNodeNew->pData != (void *)(ABC_PTRINT_T)1 );
        Abc_ObjAddFanin( pNode->pCopy, pNodeNew );
    }
    Vec_WecFree( vSupps );
    Vec_PtrFree( vSops );
    Abc_NtkSortSops( pNtkNew );
    return pNtkNew;
}